

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O0

void Cmd_teamlist(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  FTeam *this;
  char *pcVar2;
  uint local_20;
  uint uiTeam;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  Printf("Defined teams are as follows:\n");
  local_20 = 0;
  while( true ) {
    uVar1 = TArray<FTeam,_FTeam>::Size(&Teams);
    if (uVar1 <= local_20) break;
    this = TArray<FTeam,_FTeam>::operator[](&Teams,(ulong)local_20);
    pcVar2 = FTeam::GetName(this);
    Printf("%d : %s\n",(ulong)local_20,pcVar2);
    local_20 = local_20 + 1;
  }
  Printf("End of team list.\n");
  return;
}

Assistant:

CCMD (teamlist)
{
	Printf ("Defined teams are as follows:\n");

	for (unsigned int uiTeam = 0; uiTeam < Teams.Size (); uiTeam++)
		Printf ("%d : %s\n", uiTeam, Teams[uiTeam].GetName ());

	Printf ("End of team list.\n");
}